

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::HasDescriptorDecorations(IRContext *context,Instruction *var)

{
  bool bVar1;
  uint32_t uVar2;
  DecorationManager *this;
  
  this = IRContext::get_decoration_mgr(context);
  uVar2 = Instruction::result_id(var);
  bVar1 = analysis::DecorationManager::HasDecoration(this,uVar2,0x22);
  if (bVar1) {
    uVar2 = Instruction::result_id(var);
    bVar1 = analysis::DecorationManager::HasDecoration(this,uVar2,0x21);
    return bVar1;
  }
  return false;
}

Assistant:

bool HasDescriptorDecorations(IRContext* context, Instruction* var) {
  const auto& decoration_mgr = context->get_decoration_mgr();
  return decoration_mgr->HasDecoration(
             var->result_id(), uint32_t(spv::Decoration::DescriptorSet)) &&
         decoration_mgr->HasDecoration(var->result_id(),
                                       uint32_t(spv::Decoration::Binding));
}